

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O1

int process_file(input_option *opt)

{
  dblock *pdVar1;
  char *filename;
  int iVar2;
  fdb_status fVar3;
  uint uVar4;
  filemgr_ops *pfVar5;
  ulong uVar6;
  ssize_t sVar7;
  undefined8 unaff_RBX;
  long lVar8;
  long lVar9;
  fdb_file_handle *dbfile;
  uint8_t block_buf [4096];
  fdb_file_handle *local_1150;
  input_option *local_1148;
  ulong local_1140;
  char *local_1138;
  fdb_config local_1130 [17];
  
  local_1150 = (fdb_file_handle *)0x0;
  filename = opt->filename;
  fdb_get_default_config();
  local_1130[0].buffercache_size = 0;
  local_1130[0].flags = 2;
  pfVar5 = get_filemgr_ops();
  iVar2 = (*pfVar5->open)(filename,2,0x1b6);
  if (iVar2 < 0) {
LAB_0010550d:
    printf("\nUnable to open %s\n",filename);
  }
  else {
    uVar6 = (*pfVar5->file_size)(filename);
    if (opt->print_header == true) {
      fVar3 = fdb_open(&local_1150,filename,local_1130);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0010550d;
      print_header(local_1150->root);
    }
    local_1140 = uVar6 >> 0xc;
    local_1148 = opt;
    if (opt->headers_only != true) {
      if (opt->max_filesize < uVar6) {
        printf("\n File %s size %lu exceeds max size of %lu \n",filename,uVar6);
      }
      else {
        db = (dblock *)malloc(uVar6);
        if (db != (dblock *)0x0) {
          if (0xfff < uVar6) {
            lVar9 = 0;
            lVar8 = 0;
            uVar6 = 0;
            do {
              sVar7 = (*pfVar5->pread)(iVar2,db->bytes + lVar8 + -0x54,0x1000,lVar9);
              if (sVar7 == 0x1000) {
                if ((&db->marker)[lVar8] == 0xee) {
                  printf("\nDB Header %lu",uVar6);
                  decode_dblock(db->bytes + lVar8 + -0x54);
                }
              }
              else {
                if (local_1148->print_header == true) {
                  fdb_close(local_1150);
                }
                free(db);
              }
              if (sVar7 != 0x1000) {
                return -5;
              }
              uVar6 = uVar6 + 1;
              lVar8 = lVar8 + 0x1010;
              lVar9 = lVar9 + 0x1000;
            } while (local_1140 != uVar6);
          }
          uVar4 = getpid();
          printf("\nFile scanned and headers decoded\n gdb --pid=%d\n",(ulong)uVar4);
          do {
            usleep(1000);
          } while( true );
        }
        printf("\nUnable to allocate memory of %lu bytes\n",uVar6);
      }
      if (opt->print_header == true) {
        fdb_close(local_1150);
        return -1;
      }
      return -1;
    }
    local_1138 = filename;
    if (0xfff < uVar6) {
      pdVar1 = (dblock *)(local_1130 + 1);
      lVar8 = 0;
      uVar6 = 0;
      do {
        sVar7 = (*pfVar5->pread)(iVar2,pdVar1,0x1000,lVar8);
        if (sVar7 == 0x1000) {
          db = pdVar1;
          if ((char)((ulong)unaff_RBX >> 0x38) == -0x12) {
            printf("\n-------DB Header %lu at offset %lu--------",uVar6,lVar8);
            decode_dblock(db);
            printf("\ntrie_root_raw = %p",db->trie_root_raw);
            printf("\nseqtree_root_raw = %p",db->seqtree_root_raw);
            printf("\nnum_docs = %lu",db->num_docs);
            printf("\nnum_nodes = %lu",db->num_nodes);
            printf("\ndatasize = %lu",db->data_size);
            printf("\nlast_wal_flush_bid = %lu",db->last_wal_flush_bid);
            printf("\nkv_info_offset = %lu",db->kv_info_offset);
            printf("\nflags = %p",(db->field_9).hdr_flags);
            printf("\nnew_filename_len = %d",(ulong)db->new_filename_len);
            printf("\nold_filename_len = %d",(ulong)db->old_filename_len);
            printf("\ntrie_root_bid = %lu",db->trie_root_bid);
            printf("\ntrie_subblock_no = %lu",db->trie_subblock_no);
            printf("\ntrie_idx = %lu",db->trie_idx);
            printf("\nseqtree_root_bid = %lu",db->seqtree_root_bid);
            printf("\nseqtree_subblock_no = %lu",db->seqtree_subblock_no);
            printf("\nseqtree_idx = %lu",db->seqtree_idx);
            printf("\ndelta size = %lu",db->delta_size);
            printf("\nprev_hdr_bid = %lu",db->prev_hdr_bid);
            printf("\nhdr_len = %d",(ulong)db->hdr_len);
            printf("\nmagic = %p",(db->field_24).magic_bytes);
          }
        }
        else {
          fdb_close(local_1150);
        }
        if (sVar7 != 0x1000) {
          return -5;
        }
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 0x1000;
      } while (local_1140 != uVar6);
    }
    if ((local_1148->print_header == true) &&
       (fVar3 = fdb_close(local_1150), fVar3 != FDB_RESULT_SUCCESS)) {
      printf("\nUnable to close %s\n",local_1138);
      return -4;
    }
    (*pfVar5->close)(iVar2);
  }
  return -1;
}

Assistant:

int process_file(struct input_option *opt)
{
    fdb_file_handle *dbfile = NULL;
    fdb_config config;
    char *filename = opt->filename;
    uint64_t file_size;
    size_t num_blocks;
    struct filemgr file;
    uint8_t block_buf[BLK_SIZE];
    fdb_status fs;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.flags = FDB_OPEN_FLAG_RDONLY;
    file.ops = get_filemgr_ops();
    file.fd = file.ops->open(filename, O_RDWR, 0666);

    if (file.fd < 0) {
        printf("\nUnable to open %s\n", filename);
        return -1;
    }

    file_size = file.ops->file_size(filename);
    num_blocks = file_size / BLK_SIZE;

    if (opt->print_header) {
        fs = fdb_open(&dbfile, filename, &config);
        if (fs != FDB_RESULT_SUCCESS) {
            printf("\nUnable to open %s\n", filename);
            return -1;
        }
        print_header(dbfile->root);
    }
    if (opt->headers_only) {
        for (uint64_t i = 0; i < num_blocks; ++i) {
            ssize_t rv = file.ops->pread(file.fd, &block_buf, BLK_SIZE,
                                          i * BLK_SIZE);
            if (rv != BLK_SIZE) {
                fdb_close(dbfile);
                return FDB_RESULT_READ_FAIL;
            }
            db = (dblock *)&block_buf;

            if (db->marker == DBHEADER_BLK) {
                printf("\n-------DB Header %" _F64 " at offset %" _F64
                        "--------" , i, i * BLK_SIZE);
                decode_dblock(db);
                printf("\ntrie_root_raw = %p", (void*)db->trie_root_raw);
                printf("\nseqtree_root_raw = %p", (void*)db->seqtree_root_raw);
                printf("\nnum_docs = %" _F64, db->num_docs);
                printf("\nnum_nodes = %" _F64, db->num_nodes);
                printf("\ndatasize = %" _F64, db->data_size);
                printf("\nlast_wal_flush_bid = %" _F64, db->last_wal_flush_bid);
                printf("\nkv_info_offset = %" _F64, db->kv_info_offset);
                printf("\nflags = %p", db->flags);
                printf("\nnew_filename_len = %d", db->new_filename_len);
                printf("\nold_filename_len = %d", db->old_filename_len);
                printf("\ntrie_root_bid = %" _F64, db->trie_root_bid);
                printf("\ntrie_subblock_no = %" _F64, db->trie_subblock_no);
                printf("\ntrie_idx = %" _F64, db->trie_idx);
                printf("\nseqtree_root_bid = %" _F64, db->seqtree_root_bid);
                printf("\nseqtree_subblock_no = %" _F64,
                                                 db->seqtree_subblock_no);
                printf("\nseqtree_idx = %" _F64, db->seqtree_idx);
                printf("\ndelta size = %" _F64, db->delta_size);
                printf("\nprev_hdr_bid = %" _F64, db->prev_hdr_bid);
                printf("\nhdr_len = %d", db->hdr_len);
                printf("\nmagic = %p", db->magic);
            }
        }

    } else {
        if (file_size > opt->max_filesize) {
            printf("\n File %s size %" _F64" exceeds max size of %" _F64" \n",
                    filename, file_size, opt->max_filesize);

            if (opt->print_header) {
                fdb_close(dbfile);
            }
            return -1;
        }

        db = (dblock *) malloc(file_size);
        if (!db) {
            printf("\nUnable to allocate memory of %" _F64" bytes\n",
            file_size);

            if (opt->print_header) {
                fdb_close(dbfile);
            }
            return -1;
        }
        for (uint64_t i = 0; i < num_blocks; ++i) {
            ssize_t rv = file.ops->pread(file.fd, &db[i], BLK_SIZE,
                    i * BLK_SIZE);
            if (rv != BLK_SIZE) {
                if (opt->print_header) {
                    fdb_close(dbfile);
                }
                free(db);
                return FDB_RESULT_READ_FAIL;
            }
            if (db[i].marker == DBHEADER_BLK) {
                printf("\nDB Header %" _F64, i);
                decode_dblock(&db[i]);
            }
        }
#if !defined(WIN32) && !defined(_WIN32)
        printf("\nFile scanned and headers decoded\n gdb --pid=%d\n", getpid());
#endif
        while (1) {
            gdb_sleep();
        }
        free(db);
    }

    if (opt->print_header) {
        fs = fdb_close(dbfile);
        if (fs != FDB_RESULT_SUCCESS) {
            printf("\nUnable to close %s\n", filename);
            return -4;
        }
    }

    file.ops->close(file.fd);

    return -1;
}